

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall cmStateDirectory::ComputeRelativePathTopSource(cmStateDirectory *this)

{
  pointer pcVar1;
  bool bVar2;
  PointerType pBVar3;
  cmStateSnapshot *this_00;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> snapshots;
  cmStateSnapshot snapshot;
  string result;
  string currentSource;
  _Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_d8;
  value_type local_b8;
  string local_98;
  cmStateDirectory local_78;
  string local_50;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8._M_impl.super__Vector_impl_data._M_start = (cmStateSnapshot *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (cmStateSnapshot *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_d8,&local_b8);
  while( true ) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_78,&local_b8);
    local_b8.Position.Position = (PositionType)local_78.Snapshot_.State;
    local_b8.State = (cmState *)local_78.DirectoryState.Tree;
    local_b8.Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_78.DirectoryState.Position;
    bVar2 = cmStateSnapshot::IsValid(&local_b8);
    if (!bVar2) break;
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_d8,&local_b8);
  }
  cmStateSnapshot::GetDirectory(&local_78,local_d8._M_impl.super__Vector_impl_data._M_start);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&local_78.DirectoryState);
  std::__cxx11::string::string((string *)&local_98,(string *)&pBVar3->Location);
  pcVar1 = local_d8._M_impl.super__Vector_impl_data._M_finish;
  this_00 = local_d8._M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1, this_00 != pcVar1) {
    cmStateSnapshot::GetDirectory(&local_78,this_00);
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&local_78.DirectoryState);
    std::__cxx11::string::string((string *)&local_50,(string *)&pBVar3->Location);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_98,&local_50);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopSource);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base(&local_d8);
  return;
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentSource = snp.GetDirectory().GetCurrentSource();
    if (cmSystemTools::IsSubDirectory(result, currentSource)) {
      result = currentSource;
    }
  }
  this->DirectoryState->RelativePathTopSource = result;
}